

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferComputeInstance::writeDescriptorSet
          (BufferComputeInstance *this,VkDescriptorSet descriptorSet,VkBuffer viewA,deUint32 offsetA
          ,VkBuffer viewB,deUint32 offsetB,VkBuffer resBuf)

{
  DescriptorSetUpdateBuilder *this_00;
  ShaderInputInterface SVar1;
  VkDescriptorType descriptorType;
  VkDescriptorBufferInfo *pBufferInfo;
  Location local_80;
  VkDescriptorBufferInfo bufferInfos [2];
  VkDescriptorBufferInfo resultInfo;
  
  resultInfo.buffer = resBuf;
  resultInfo.offset = 0;
  resultInfo.range = 0x40;
  bufferInfos[0].offset = (VkDeviceSize)offsetA;
  bufferInfos[0].range = 0x20;
  bufferInfos[1].offset = (VkDeviceSize)offsetB;
  bufferInfos[1].range = 0x20;
  this_00 = &this->m_updateBuilder;
  local_80.m_binding = 0;
  local_80.m_arrayElement = 0;
  bufferInfos[0].buffer.m_internal = viewA.m_internal;
  bufferInfos[1].buffer.m_internal = viewB.m_internal;
  ::vk::DescriptorSetUpdateBuilder::writeSingle
            (this_00,descriptorSet,&local_80,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,&resultInfo);
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
    local_80.m_binding = 1;
    local_80.m_arrayElement = 0;
    ::vk::DescriptorSetUpdateBuilder::writeArray
              (this_00,descriptorSet,&local_80,this->m_descriptorType,2,bufferInfos);
  }
  else {
    if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
      pBufferInfo = bufferInfos + 1;
      local_80.m_binding = 1;
      local_80.m_arrayElement = 0;
      ::vk::DescriptorSetUpdateBuilder::writeSingle
                (this_00,descriptorSet,&local_80,this->m_descriptorType,bufferInfos);
      local_80.m_binding = 2;
      local_80.m_arrayElement = 0;
      descriptorType = this->m_descriptorType;
    }
    else {
      if (SVar1 != SHADER_INPUT_SINGLE_DESCRIPTOR) goto LAB_0054b2d1;
      local_80.m_binding = 1;
      local_80.m_arrayElement = 0;
      descriptorType = this->m_descriptorType;
      pBufferInfo = bufferInfos;
    }
    ::vk::DescriptorSetUpdateBuilder::writeSingle
              (this_00,descriptorSet,&local_80,descriptorType,pBufferInfo);
  }
LAB_0054b2d1:
  if (this->m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL) {
    ::vk::DescriptorSetUpdateBuilder::update(this_00,this->m_vki,this->m_device);
  }
  return;
}

Assistant:

void BufferComputeInstance::writeDescriptorSet (vk::VkDescriptorSet descriptorSet, vk::VkBuffer viewA, deUint32 offsetA, vk::VkBuffer viewB, deUint32 offsetB, vk::VkBuffer resBuf)
{
	const vk::VkDescriptorBufferInfo		resultInfo		= vk::makeDescriptorBufferInfo(resBuf, 0u, (vk::VkDeviceSize)ComputeInstanceResultBuffer::DATA_SIZE);
	const vk::VkDescriptorBufferInfo		bufferInfos[2]	=
	{
		vk::makeDescriptorBufferInfo(viewA, (vk::VkDeviceSize)offsetA, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
		vk::makeDescriptorBufferInfo(viewB, (vk::VkDeviceSize)offsetB, (vk::VkDeviceSize)sizeof(tcu::Vec4[2])),
	};

	// result
	m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(0u), vk::VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &resultInfo);

	// buffers
	switch (m_shaderInterface)
	{
		case SHADER_INPUT_SINGLE_DESCRIPTOR:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			break;

		case SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS:
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, &bufferInfos[0]);
			m_updateBuilder.writeSingle(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(2u), m_descriptorType, &bufferInfos[1]);
			break;

		case SHADER_INPUT_DESCRIPTOR_ARRAY:
			m_updateBuilder.writeArray(descriptorSet, vk::DescriptorSetUpdateBuilder::Location::binding(1u), m_descriptorType, 2u, bufferInfos);
			break;

		default:
			DE_FATAL("Impossible");
	}

	if (m_updateMethod == DESCRIPTOR_UPDATE_METHOD_NORMAL)
	{
		m_updateBuilder.update(m_vki, m_device);
	}
}